

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

pool_ptr<soul::AST::ModuleBase> __thiscall
soul::AST::Scope::findSubModuleNamed(Scope *this,Identifier name)

{
  _func_int **pp_Var1;
  long lVar2;
  _func_int *p_Var3;
  long *plVar4;
  _func_int *in_RDX;
  bool bVar5;
  undefined1 auVar6 [16];
  
  auVar6 = (**(code **)(((name.name)->_M_dataplus)._M_p + 0x88))(name.name);
  for (plVar4 = auVar6._0_8_; bVar5 = plVar4 != auVar6._8_8_, bVar5; plVar4 = plVar4 + 1) {
    pp_Var1 = (_func_int **)*plVar4;
    if ((pp_Var1[8] == in_RDX) && (pp_Var1[10] == pp_Var1[0xb])) {
      this->_vptr_Scope = pp_Var1;
      if (bVar5) {
        return (pool_ptr<soul::AST::ModuleBase>)(ModuleBase *)this;
      }
      break;
    }
  }
  auVar6 = (**(code **)(((name.name)->_M_dataplus)._M_p + 0x80))(name.name);
  plVar4 = auVar6._0_8_;
  bVar5 = plVar4 == auVar6._8_8_;
  if (!bVar5) {
    lVar2 = *plVar4;
    p_Var3 = *(_func_int **)(lVar2 + 0x28);
    while (p_Var3 != in_RDX) {
      plVar4 = plVar4 + 1;
      bVar5 = plVar4 == auVar6._8_8_;
      if (bVar5) goto LAB_00207f54;
      lVar2 = *plVar4;
      p_Var3 = *(_func_int **)(lVar2 + 0x28);
    }
    this->_vptr_Scope = *(_func_int ***)(lVar2 + 0x40);
    if (!bVar5) {
      return (pool_ptr<soul::AST::ModuleBase>)(ModuleBase *)this;
    }
  }
LAB_00207f54:
  this->_vptr_Scope = (_func_int **)0x0;
  return (pool_ptr<soul::AST::ModuleBase>)(ModuleBase *)this;
}

Assistant:

pool_ptr<ModuleBase> findSubModuleNamed (Identifier name) const
        {
            for (auto& m : getSubModules())
                if (m->name == name && (! m->isTemplateModule()))
                    return m;

            for (auto& a : getNamespaceAliases())
                if (a->name == name)
                    return a->resolvedNamespace;

            return {};
        }